

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListRecord.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ListRecord *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_EAX;
  undefined4 in_register_00000084;
  int in_stack_ffffffffffffffc0;
  
  readMetadata<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->metadata,(ListRecord *)it,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_ffffffffffffffc0);
  record::Sequence::
  read<njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&this->data,
             (Sequence *)
             ((_Head_base<4UL,_long,_false> *)
             ((long)&(this->metadata).fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long> + 8
             ))->_M_head_impl,(long)it,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,MF,MT,in_EAX);
  return;
}

Assistant:

ListRecord( Iterator& it, const Iterator& end, long& lineNumber,
                int MAT, int MF, int MT )
      try: metadata( readMetadata( it, end, lineNumber, MAT, MF, MT ) ),
           data( record::Sequence::read< record::Real >
                  ( std::get<4>( this->metadata.fields ),
                    it, end, lineNumber, MAT, MF, MT ) ){
      } catch ( std::exception& e ){
        Log::info( "Error encountered while parsing List record" );
        throw e;
      } catch ( int nPosition ){
        Log::info( "Error in position {}" );
        throw std::exception();
      }